

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

UBool __thiscall
icu_63::Calendar::getImmediatePreviousZoneTransition
          (Calendar *this,UDate base,UDate *transitionTime,UErrorCode *status)

{
  int iVar1;
  bool bVar2;
  UDate UVar3;
  undefined1 local_58 [7];
  UBool hasTransition;
  TimeZoneTransition trans;
  BasicTimeZone *btz;
  UErrorCode *status_local;
  UDate *transitionTime_local;
  UDate base_local;
  Calendar *this_local;
  
  trans.fTo = (TimeZoneRule *)getBasicTimeZone(this);
  if (trans.fTo == (TimeZoneRule *)0x0) {
    *status = U_UNSUPPORTED_ERROR;
  }
  else {
    TimeZoneTransition::TimeZoneTransition((TimeZoneTransition *)local_58);
    iVar1 = (*((trans.fTo)->super_UObject)._vptr_UObject[0xf])
                      (base,trans.fTo,1,(TimeZoneTransition *)local_58);
    bVar2 = (char)iVar1 == '\0';
    if (bVar2) {
      *status = U_INTERNAL_PROGRAM_ERROR;
    }
    else {
      UVar3 = TimeZoneTransition::getTime((TimeZoneTransition *)local_58);
      *transitionTime = UVar3;
      this_local._7_1_ = '\x01';
    }
    TimeZoneTransition::~TimeZoneTransition((TimeZoneTransition *)local_58);
    if (!bVar2) {
      return this_local._7_1_;
    }
  }
  return '\0';
}

Assistant:

UBool Calendar::getImmediatePreviousZoneTransition(UDate base, UDate *transitionTime, UErrorCode& status) const {
    BasicTimeZone *btz = getBasicTimeZone();
    if (btz) {
        TimeZoneTransition trans;
        UBool hasTransition = btz->getPreviousTransition(base, TRUE, trans);
        if (hasTransition) {
            *transitionTime = trans.getTime();
            return TRUE;
        } else {
            // Could not find any transitions.
            // Note: This should never happen.
            status = U_INTERNAL_PROGRAM_ERROR;
        }
    } else {
        // If not BasicTimeZone, return unsupported error for now.
        // TODO: We may support non-BasicTimeZone in future.
        status = U_UNSUPPORTED_ERROR;
    }
    return FALSE;
}